

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_validate_key_attributes(psa_key_attributes_t *attributes,psa_se_drv_table_entry_t **p_drv)

{
  size_t sVar1;
  psa_status_t status;
  psa_se_drv_table_entry_t **p_drv_local;
  psa_key_attributes_t *attributes_local;
  
  if ((((attributes->core).lifetime == 0) ||
      (attributes_local._4_4_ =
            psa_validate_persistent_key_parameters
                      ((attributes->core).lifetime,(attributes->core).id,p_drv,1),
      attributes_local._4_4_ == 0)) &&
     (attributes_local._4_4_ = psa_validate_key_policy(&(attributes->core).policy),
     attributes_local._4_4_ == 0)) {
    sVar1 = psa_get_key_bits(attributes);
    if (sVar1 < 0xfff9) {
      if (((attributes->core).flags & 0xfffe) == 0) {
        attributes_local._4_4_ = 0;
      }
      else {
        attributes_local._4_4_ = -0x87;
      }
    }
    else {
      attributes_local._4_4_ = -0x86;
    }
  }
  return attributes_local._4_4_;
}

Assistant:

static psa_status_t psa_validate_key_attributes(
    const psa_key_attributes_t *attributes,
    psa_se_drv_table_entry_t **p_drv )
{
    psa_status_t status;

    if( attributes->core.lifetime != PSA_KEY_LIFETIME_VOLATILE )
    {
        status = psa_validate_persistent_key_parameters(
            attributes->core.lifetime, attributes->core.id,
            p_drv, 1 );
        if( status != PSA_SUCCESS )
            return( status );
    }

    status = psa_validate_key_policy( &attributes->core.policy );
    if( status != PSA_SUCCESS )
        return( status );

    /* Refuse to create overly large keys.
     * Note that this doesn't trigger on import if the attributes don't
     * explicitly specify a size (so psa_get_key_bits returns 0), so
     * psa_import_key() needs its own checks. */
    if( psa_get_key_bits( attributes ) > PSA_MAX_KEY_BITS )
        return( PSA_ERROR_NOT_SUPPORTED );

    /* Reject invalid flags. These should not be reachable through the API. */
    if( attributes->core.flags & ~ ( MBEDTLS_PSA_KA_MASK_EXTERNAL_ONLY |
                                     MBEDTLS_PSA_KA_MASK_DUAL_USE ) )
        return( PSA_ERROR_INVALID_ARGUMENT );

    return( PSA_SUCCESS );
}